

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_table_functions.cpp
# Opt level: O1

void my_bind(duckdb_bind_info info)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  duckdb_logical_type type;
  duckdb_value param;
  undefined4 local_cc;
  long local_c8;
  SourceLineInfo local_c0;
  AssertionHandler local_b0;
  ITransientExpression local_68;
  long *local_58;
  char *local_50;
  size_t sStack_48;
  undefined4 *local_40;
  StringRef local_38;
  
  local_68._vptr_ITransientExpression = (_func_int **)0x4b2011;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  local_c0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/capi_table_functions.cpp"
  ;
  local_c0.line = 0xb;
  Catch::StringRef::StringRef(&local_38,"duckdb_bind_get_parameter_count(info) == 1");
  Catch::AssertionHandler::AssertionHandler
            (&local_b0,(StringRef *)&local_68,&local_c0,local_38,Normal);
  lVar1 = duckdb_bind_get_parameter_count(info);
  local_cc = 1;
  local_c8 = lVar1;
  Catch::StringRef::StringRef((StringRef *)&local_c0,"==");
  local_68.m_result = lVar1 == 1;
  local_68.m_isBinaryExpression = true;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005cf648;
  local_50 = local_c0.file;
  sStack_48 = local_c0.line;
  local_58 = &local_c8;
  local_40 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_b0,&local_68);
  Catch::ITransientExpression::~ITransientExpression(&local_68);
  Catch::AssertionHandler::complete(&local_b0);
  if (local_b0.m_completed == false) {
    (*(local_b0.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  local_b0.m_assertionInfo.macroName.m_start = (char *)duckdb_create_logical_type(5);
  duckdb_bind_add_result_column(info,"forty_two",local_b0.m_assertionInfo.macroName.m_start);
  duckdb_destroy_logical_type(&local_b0);
  puVar2 = (undefined8 *)malloc(8);
  local_68._vptr_ITransientExpression = (_func_int **)duckdb_bind_get_parameter(info,0);
  uVar3 = duckdb_get_int64(local_68._vptr_ITransientExpression);
  *puVar2 = uVar3;
  duckdb_destroy_value(&local_68);
  duckdb_bind_set_bind_data(info,puVar2,free);
  return;
}

Assistant:

void my_bind(duckdb_bind_info info) {
	REQUIRE(duckdb_bind_get_parameter_count(info) == 1);

	duckdb_logical_type type = duckdb_create_logical_type(DUCKDB_TYPE_BIGINT);
	duckdb_bind_add_result_column(info, "forty_two", type);
	duckdb_destroy_logical_type(&type);

	auto my_bind_data = (my_bind_data_struct *)malloc(sizeof(my_bind_data_struct));
	auto param = duckdb_bind_get_parameter(info, 0);
	my_bind_data->size = duckdb_get_int64(param);
	duckdb_destroy_value(&param);

	duckdb_bind_set_bind_data(info, my_bind_data, free);
}